

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

DWORD CONTEXTGetExceptionCodeForSignal(siginfo_t *siginfo,native_context_t *context)

{
  int iVar1;
  native_context_t *context_local;
  siginfo_t *siginfo_local;
  
  switch(siginfo->si_signo) {
  case 4:
    iVar1 = siginfo->si_code;
    if (3 < iVar1 - 1U) {
      if (iVar1 - 5U < 2) {
        return 0xc0000096;
      }
      if (iVar1 != 7) {
        if (iVar1 != 8) {
          return 0xc000001d;
        }
        return 0xc00000fd;
      }
    }
    return 0xc000001d;
  case 5:
    if ((uint)siginfo->si_code < 2) {
      return 0x80000003;
    }
    if (siginfo->si_code == 2) {
      return 0x80000004;
    }
    return 0xc000001d;
  default:
    break;
  case 7:
    if (siginfo->si_code == 1) {
      return 0x80000002;
    }
    if (siginfo->si_code == 2) {
      return 0xc0000005;
    }
    break;
  case 8:
    switch(siginfo->si_code) {
    case 1:
      return 0xc0000094;
    case 2:
      return 0xc0000095;
    case 3:
      return 0xc000008e;
    case 4:
      return 0xc0000091;
    case 5:
      return 0xc0000093;
    case 6:
      return 0xc000008f;
    case 7:
      return 0xc0000090;
    case 8:
      return 0xc0000090;
    }
    break;
  case 0xb:
    if ((uint)siginfo->si_code < 3) {
      return 0xc0000005;
    }
  }
  return 0xc000001d;
}

Assistant:

DWORD CONTEXTGetExceptionCodeForSignal(const siginfo_t *siginfo,
                                       const native_context_t *context)
{
    // IMPORTANT NOTE: This function must not call any signal unsafe functions
    // since it is called from signal handlers.
    // That includes ASSERT and TRACE macros.

    switch (siginfo->si_signo)
    {
        case SIGILL:
            switch (siginfo->si_code)
            {
                case ILL_ILLOPC:    // Illegal opcode
                case ILL_ILLOPN:    // Illegal operand
                case ILL_ILLADR:    // Illegal addressing mode
                case ILL_ILLTRP:    // Illegal trap
                case ILL_COPROC:    // Co-processor error
                    return EXCEPTION_ILLEGAL_INSTRUCTION;
                case ILL_PRVOPC:    // Privileged opcode
                case ILL_PRVREG:    // Privileged register
                    return EXCEPTION_PRIV_INSTRUCTION;
                case ILL_BADSTK:    // Internal stack error
                    return EXCEPTION_STACK_OVERFLOW;
                default:
                    break;
            }
            break;
        case SIGFPE:
            switch (siginfo->si_code)
            {
                case FPE_INTDIV:
                    return EXCEPTION_INT_DIVIDE_BY_ZERO;
                case FPE_INTOVF:
                    return EXCEPTION_INT_OVERFLOW;
                case FPE_FLTDIV:
                    return EXCEPTION_FLT_DIVIDE_BY_ZERO;
                case FPE_FLTOVF:
                    return EXCEPTION_FLT_OVERFLOW;
                case FPE_FLTUND:
                    return EXCEPTION_FLT_UNDERFLOW;
                case FPE_FLTRES:
                    return EXCEPTION_FLT_INEXACT_RESULT;
                case FPE_FLTINV:
                    return EXCEPTION_FLT_INVALID_OPERATION;
                case FPE_FLTSUB:
                    return EXCEPTION_FLT_INVALID_OPERATION;
                default:
                    break;
            }
            break;
        case SIGSEGV:
            switch (siginfo->si_code)
            {
                case SI_USER:       // User-generated signal, sometimes sent
                                    // for SIGSEGV under normal circumstances
                case SEGV_MAPERR:   // Address not mapped to object
                case SEGV_ACCERR:   // Invalid permissions for mapped object
                    return EXCEPTION_ACCESS_VIOLATION;
                default:
                    break;
            }
            break;
        case SIGBUS:
            switch (siginfo->si_code)
            {
                case BUS_ADRALN:    // Invalid address alignment
                    return EXCEPTION_DATATYPE_MISALIGNMENT;
                case BUS_ADRERR:    // Non-existent physical address
                    return EXCEPTION_ACCESS_VIOLATION;
                case BUS_OBJERR:    // Object-specific hardware error
                default:
                    break;
            }
            break;
        case SIGTRAP:
            switch (siginfo->si_code)
            {
                case SI_USER:
                case TRAP_BRKPT:    // Process breakpoint
                    return EXCEPTION_BREAKPOINT;
                case TRAP_TRACE:    // Process trace trap
                    return EXCEPTION_SINGLE_STEP;
                default:
                    // Got unknown SIGTRAP signal with code siginfo->si_code;
                    return EXCEPTION_ILLEGAL_INSTRUCTION;
            }
        default:
            break;
    }

    // Got unknown signal number siginfo->si_signo with code siginfo->si_code;
    return EXCEPTION_ILLEGAL_INSTRUCTION;
}